

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseEXRHeaderFromMemory(EXRHeader *exr_header,EXRVersion *version,uchar *memory,char **err)

{
  ulong uVar1;
  char *pcVar2;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int ret;
  string err_str;
  HeaderInfo info;
  char *marker;
  char *buf;
  uchar *in_stack_000002b8;
  string *in_stack_000002c0;
  EXRVersion *in_stack_000002c8;
  bool *in_stack_000002d0;
  HeaderInfo *in_stack_000002d8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int iVar3;
  string local_e8 [32];
  HeaderInfo *in_stack_ffffffffffffff38;
  EXRHeader *in_stack_ffffffffffffff40;
  int local_4;
  
  if ((in_RDX == 0) || (in_RDI == 0)) {
    if (in_RCX != (undefined8 *)0x0) {
      *in_RCX = "Invalid argument.\n";
    }
    local_4 = -3;
  }
  else {
    tinyexr::anon_struct_128_15_3efe3611::HeaderInfo
              ((anon_struct_128_15_3efe3611 *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    tinyexr::anon_struct_128_15_3efe3611::clear
              ((anon_struct_128_15_3efe3611 *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    std::__cxx11::string::string(local_e8);
    local_4 = tinyexr::ParseEXRHeader
                        (in_stack_000002d8,in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,
                         in_stack_000002b8);
    iVar3 = local_4;
    if (((local_4 != 0) && (in_RCX != (undefined8 *)0x0)) &&
       (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      pcVar2 = strdup(pcVar2);
      *in_RCX = pcVar2;
    }
    tinyexr::ConvertHeader(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    *(undefined4 *)(in_RDI + 0x38) = *(undefined4 *)(in_RSI + 4);
    std::__cxx11::string::~string(local_e8);
    tinyexr::anon_struct_128_15_3efe3611::~HeaderInfo
              ((anon_struct_128_15_3efe3611 *)CONCAT44(iVar3,in_stack_ffffffffffffff00));
  }
  return local_4;
}

Assistant:

int ParseEXRHeaderFromMemory(EXRHeader *exr_header, const EXRVersion *version,
                             const unsigned char *memory, const char **err) {
  if (memory == NULL || exr_header == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }

    // Invalid argument
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  const char *buf = reinterpret_cast<const char *>(memory);

  const char *marker = &buf[4 + 4];  // skip magic number + version header

  tinyexr::HeaderInfo info;
  info.clear();

  std::string err_str;
  int ret = ParseEXRHeader(&info, NULL, version, &err_str,
                           reinterpret_cast<const unsigned char *>(marker));

  if (ret != TINYEXR_SUCCESS) {
    if (err && !err_str.empty()) {
      (*err) = strdup(err_str.c_str());  // May leak
    }
  }

  ConvertHeader(exr_header, info);

  // transfoer `tiled` from version.
  exr_header->tiled = version->tiled;

  return ret;
}